

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O1

string * duckdb::Bit::NumericToBit<unsigned_char>(string *__return_storage_ptr__,uchar numeric)

{
  void *pvVar1;
  char *pcVar2;
  bitstring_t output_str;
  anon_union_16_2_67f50693_for_value local_28;
  
  pvVar1 = operator_new__(2);
  local_28.pointer.length = 2;
  local_28._6_2_ = 0;
  local_28._8_4_ = 0;
  local_28._12_4_ = 0;
  local_28.pointer.prefix[0] = '\0';
  local_28.pointer.prefix[1] = numeric;
  Finalize((bitstring_t *)&local_28.pointer);
  if ((ulong)local_28.pointer.length < 0xd) {
    pcVar2 = local_28.pointer.prefix;
  }
  else {
    pcVar2 = (char *)CONCAT44(local_28._12_4_,local_28._8_4_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + local_28.pointer.length);
  operator_delete__(pvVar1);
  return __return_storage_ptr__;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}